

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void av1_set_frame_refs(AV1_COMMON *cm,int *remapped_ref_idx,int lst_map_idx,int gld_map_idx)

{
  RefCntBuffer *pRVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  REF_FRAME_INFO *pRVar6;
  int *piVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined4 uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint local_13c [11];
  int *local_110;
  OrderHintInfo *local_108;
  long local_100;
  REF_FRAME_INFO ref_frame_info [8];
  
  local_13c[0] = (cm->current_frame).order_hint;
  iVar8 = 1 << ((byte)(cm->seq_params->order_hint_info).order_hint_bits_minus_1 & 0x1f);
  local_13c[5] = 0;
  local_13c[6] = 0;
  local_13c[7] = 0;
  local_13c[1] = 0;
  local_13c[2] = 0;
  local_13c[3] = 0;
  local_13c[4] = 0;
  local_108 = &cm->seq_params->order_hint_info;
  piVar7 = &ref_frame_info[0].sort_idx;
  local_100 = -(ulong)(uint)gld_map_idx;
  iVar3 = -1;
  iVar5 = -1;
  local_110 = remapped_ref_idx;
  for (lVar14 = -8; lVar14 != 0; lVar14 = lVar14 + 1) {
    ((REF_FRAME_INFO *)(piVar7 + -4))->map_idx = (int)lVar14 + 8;
    *piVar7 = -1;
    pRVar1 = cm->ref_frame_map[lVar14 + 8];
    *(RefCntBuffer **)(piVar7 + -2) = pRVar1;
    if (pRVar1 != (RefCntBuffer *)0x0) {
      iVar2 = -1;
      if (pRVar1->order_hint != 0xffffffff) {
        iVar2 = get_relative_dist(local_108,pRVar1->order_hint,local_13c[0]);
        iVar2 = iVar2 + iVar8;
      }
      if (lVar14 - (ulong)(uint)lst_map_idx == -8) {
        iVar3 = iVar2;
      }
      *piVar7 = iVar2;
      if (local_100 + lVar14 == -8) {
        iVar5 = iVar2;
      }
    }
    piVar7 = piVar7 + 6;
  }
  if ((iVar3 == -1) || (iVar8 <= iVar3)) {
    aom_internal_error(cm->error,AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as LAST");
  }
  piVar7 = local_110;
  if ((iVar5 == -1) || (iVar8 <= iVar5)) {
    aom_internal_error(cm->error,AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as GOLDEN");
  }
  uVar15 = 7;
  qsort(ref_frame_info,8,0x18,compare_ref_frame_info);
  lVar14 = 0;
  pRVar6 = ref_frame_info;
  iVar3 = 0;
  do {
    pRVar6 = pRVar6 + 1;
    if (lVar14 == -8) {
LAB_0032b5db:
      lVar4 = (long)iVar3;
      pRVar6 = ref_frame_info + lVar4;
      local_13c[4] = 0;
      uVar11 = 0;
      for (lVar14 = lVar4; lVar14 <= (int)uVar15; lVar14 = lVar14 + 1) {
        iVar3 = pRVar6->map_idx;
        if (iVar3 == lst_map_idx) {
          *piVar7 = lst_map_idx;
          uVar11 = 1;
        }
        if (iVar3 == gld_map_idx) {
          piVar7[3] = gld_map_idx;
          local_13c[4] = 1;
        }
        pRVar6 = pRVar6 + 1;
      }
      local_13c[1] = uVar11;
      uVar10 = 0;
      uVar9 = 5;
      do {
        if (uVar10 == 5) {
LAB_0032b6bd:
          for (; uVar9 != 5; uVar9 = uVar9 + 1) {
            lVar14 = (long)"\x02\x03\x05\x06\a"[uVar9];
            if (local_13c[lVar14] != 1) {
              piVar7[lVar14 + -1] = ref_frame_info[lVar4].map_idx;
              local_13c[lVar14] = 1;
            }
          }
          return;
        }
        lVar14 = (long)"\x02\x03\x05\x06\a"[uVar10];
        if (local_13c[lVar14] != 1) {
          lVar13 = (long)(int)uVar15;
          lVar12 = lVar13 << 0x20;
          pRVar6 = ref_frame_info + lVar13;
          while( true ) {
            uVar15 = uVar15 - 1;
            if (lVar13 < lVar4) {
              uVar9 = uVar10 & 0xffffffff;
              goto LAB_0032b6bd;
            }
            if (pRVar6->map_idx != lst_map_idx && pRVar6->map_idx != gld_map_idx) break;
            lVar13 = lVar13 + -1;
            lVar12 = lVar12 + -0x100000000;
            pRVar6 = pRVar6 + -1;
          }
          piVar7[lVar14 + -1] = ref_frame_info[lVar12 >> 0x20].map_idx;
          local_13c[lVar14] = 1;
        }
        uVar10 = uVar10 + 1;
      } while( true );
    }
    if (pRVar6[-1].sort_idx == -1) {
      iVar3 = iVar3 + 1;
    }
    else if (iVar8 <= pRVar6[-1].sort_idx) {
      piVar7[6] = ref_frame_info[7].map_idx;
      local_13c[7] = 1;
      if (lVar14 == -7) {
        uVar15 = 6;
      }
      else {
        piVar7[4] = pRVar6[-1].map_idx;
        local_13c[5] = 1;
        if ((ulong)-lVar14 < 5 || lVar14 == -5) {
          uVar15 = ~(uint)lVar14;
          piVar7[5] = pRVar6->map_idx;
          local_13c[6] = 1;
          local_13c[7] = 1;
        }
        else {
          uVar15 = 5;
        }
      }
      goto LAB_0032b5db;
    }
    lVar14 = lVar14 + -1;
  } while( true );
}

Assistant:

void av1_set_frame_refs(AV1_COMMON *const cm, int *remapped_ref_idx,
                        int lst_map_idx, int gld_map_idx) {
  int lst_frame_sort_idx = -1;
  int gld_frame_sort_idx = -1;

  assert(cm->seq_params->order_hint_info.enable_order_hint);
  assert(cm->seq_params->order_hint_info.order_hint_bits_minus_1 >= 0);
  const int cur_order_hint = (int)cm->current_frame.order_hint;
  const int cur_frame_sort_idx =
      1 << cm->seq_params->order_hint_info.order_hint_bits_minus_1;

  REF_FRAME_INFO ref_frame_info[REF_FRAMES];
  int ref_flag_list[INTER_REFS_PER_FRAME] = { 0, 0, 0, 0, 0, 0, 0 };

  for (int i = 0; i < REF_FRAMES; ++i) {
    const int map_idx = i;

    ref_frame_info[i].map_idx = map_idx;
    ref_frame_info[i].sort_idx = -1;

    RefCntBuffer *const buf = cm->ref_frame_map[map_idx];
    ref_frame_info[i].buf = buf;

    if (buf == NULL) continue;
    // If this assertion fails, there is a reference leak.
    assert(buf->ref_count > 0);

    const int offset = (int)buf->order_hint;
    ref_frame_info[i].sort_idx =
        (offset == -1) ? -1
                       : cur_frame_sort_idx +
                             get_relative_dist(&cm->seq_params->order_hint_info,
                                               offset, cur_order_hint);
    assert(ref_frame_info[i].sort_idx >= -1);

    if (map_idx == lst_map_idx) lst_frame_sort_idx = ref_frame_info[i].sort_idx;
    if (map_idx == gld_map_idx) gld_frame_sort_idx = ref_frame_info[i].sort_idx;
  }

  // Confirm both LAST_FRAME and GOLDEN_FRAME are valid forward reference
  // frames.
  if (lst_frame_sort_idx == -1 || lst_frame_sort_idx >= cur_frame_sort_idx) {
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as LAST");
  }
  if (gld_frame_sort_idx == -1 || gld_frame_sort_idx >= cur_frame_sort_idx) {
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as GOLDEN");
  }

  // Sort ref frames based on their frame_offset values.
  qsort(ref_frame_info, REF_FRAMES, sizeof(REF_FRAME_INFO),
        compare_ref_frame_info);

  // Identify forward and backward reference frames.
  // Forward  reference: offset < order_hint
  // Backward reference: offset >= order_hint
  int fwd_start_idx = 0, fwd_end_idx = REF_FRAMES - 1;

  for (int i = 0; i < REF_FRAMES; i++) {
    if (ref_frame_info[i].sort_idx == -1) {
      fwd_start_idx++;
      continue;
    }

    if (ref_frame_info[i].sort_idx >= cur_frame_sort_idx) {
      fwd_end_idx = i - 1;
      break;
    }
  }

  int bwd_start_idx = fwd_end_idx + 1;
  int bwd_end_idx = REF_FRAMES - 1;

  // === Backward Reference Frames ===

  // == ALTREF_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, ALTREF_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_end_idx]);
    ref_flag_list[ALTREF_FRAME - LAST_FRAME] = 1;
    bwd_end_idx--;
  }

  // == BWDREF_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, BWDREF_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_start_idx]);
    ref_flag_list[BWDREF_FRAME - LAST_FRAME] = 1;
    bwd_start_idx++;
  }

  // == ALTREF2_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, ALTREF2_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_start_idx]);
    ref_flag_list[ALTREF2_FRAME - LAST_FRAME] = 1;
  }

  // === Forward Reference Frames ===

  for (int i = fwd_start_idx; i <= fwd_end_idx; ++i) {
    // == LAST_FRAME ==
    if (ref_frame_info[i].map_idx == lst_map_idx) {
      set_ref_frame_info(remapped_ref_idx, LAST_FRAME - LAST_FRAME,
                         &ref_frame_info[i]);
      ref_flag_list[LAST_FRAME - LAST_FRAME] = 1;
    }

    // == GOLDEN_FRAME ==
    if (ref_frame_info[i].map_idx == gld_map_idx) {
      set_ref_frame_info(remapped_ref_idx, GOLDEN_FRAME - LAST_FRAME,
                         &ref_frame_info[i]);
      ref_flag_list[GOLDEN_FRAME - LAST_FRAME] = 1;
    }
  }

  assert(ref_flag_list[LAST_FRAME - LAST_FRAME] == 1 &&
         ref_flag_list[GOLDEN_FRAME - LAST_FRAME] == 1);

  // == LAST2_FRAME ==
  // == LAST3_FRAME ==
  // == BWDREF_FRAME ==
  // == ALTREF2_FRAME ==
  // == ALTREF_FRAME ==

  // Set up the reference frames in the anti-chronological order.
  static const MV_REFERENCE_FRAME ref_frame_list[INTER_REFS_PER_FRAME - 2] = {
    LAST2_FRAME, LAST3_FRAME, BWDREF_FRAME, ALTREF2_FRAME, ALTREF_FRAME
  };

  int ref_idx;
  for (ref_idx = 0; ref_idx < (INTER_REFS_PER_FRAME - 2); ref_idx++) {
    const MV_REFERENCE_FRAME ref_frame = ref_frame_list[ref_idx];

    if (ref_flag_list[ref_frame - LAST_FRAME] == 1) continue;

    while (fwd_start_idx <= fwd_end_idx &&
           (ref_frame_info[fwd_end_idx].map_idx == lst_map_idx ||
            ref_frame_info[fwd_end_idx].map_idx == gld_map_idx)) {
      fwd_end_idx--;
    }
    if (fwd_start_idx > fwd_end_idx) break;

    set_ref_frame_info(remapped_ref_idx, ref_frame - LAST_FRAME,
                       &ref_frame_info[fwd_end_idx]);
    ref_flag_list[ref_frame - LAST_FRAME] = 1;

    fwd_end_idx--;
  }

  // Assign all the remaining frame(s), if any, to the earliest reference
  // frame.
  for (; ref_idx < (INTER_REFS_PER_FRAME - 2); ref_idx++) {
    const MV_REFERENCE_FRAME ref_frame = ref_frame_list[ref_idx];
    if (ref_flag_list[ref_frame - LAST_FRAME] == 1) continue;
    set_ref_frame_info(remapped_ref_idx, ref_frame - LAST_FRAME,
                       &ref_frame_info[fwd_start_idx]);
    ref_flag_list[ref_frame - LAST_FRAME] = 1;
  }

  for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
    assert(ref_flag_list[i] == 1);
  }
}